

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_startShaderProgram(qpTestLog *log,deBool linkOk,char *linkInfoLog)

{
  deBool dVar1;
  long lVar2;
  char *value;
  undefined1 local_d0 [16];
  char *local_c0;
  char *local_b8;
  int local_ac;
  undefined1 local_a8 [4];
  int numProgramAttribs;
  qpXmlAttribute programAttribs [4];
  char *linkInfoLog_local;
  deBool linkOk_local;
  qpTestLog *log_local;
  
  local_ac = 0;
  programAttribs[3]._24_8_ = linkInfoLog;
  deMutex_lock(log->lock);
  lVar2 = (long)local_ac;
  value = "Fail";
  if (linkOk != 0) {
    value = "OK";
  }
  local_ac = local_ac + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_d0,"LinkStatus",value);
  *(undefined8 *)(local_a8 + lVar2 * 0x20) = local_d0._0_8_;
  programAttribs[lVar2].name = (char *)local_d0._8_8_;
  *(char **)&programAttribs[lVar2].type = local_c0;
  programAttribs[lVar2].stringValue = local_b8;
  dVar1 = qpXmlWriter_startElement(log->writer,"ShaderProgram",local_ac,(qpXmlAttribute *)local_a8);
  if ((dVar1 != 0) &&
     (dVar1 = qpXmlWriter_writeStringElement(log->writer,"InfoLog",(char *)programAttribs[3]._24_8_)
     , dVar1 != 0)) {
    deMutex_unlock(log->lock);
    return 1;
  }
  qpPrintf("qpTestLog_startShaderProgram(): Writing XML failed\n");
  deMutex_unlock(log->lock);
  return 0;
}

Assistant:

deBool qpTestLog_startShaderProgram (qpTestLog* log, deBool linkOk, const char* linkInfoLog)
{
	qpXmlAttribute	programAttribs[4];
	int				numProgramAttribs = 0;

	DE_ASSERT(log);
	deMutex_lock(log->lock);

	programAttribs[numProgramAttribs++] = qpSetStringAttrib("LinkStatus", linkOk ? "OK" : "Fail");

	if (!qpXmlWriter_startElement(log->writer, "ShaderProgram", numProgramAttribs, programAttribs) ||
		!qpXmlWriter_writeStringElement(log->writer, "InfoLog", linkInfoLog))
	{
		qpPrintf("qpTestLog_startShaderProgram(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_push(&log->containerStack, CONTAINERTYPE_SHADERPROGRAM));

	deMutex_unlock(log->lock);
	return DE_TRUE;
}